

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_conv_2d_dw(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  undefined1 (*pauVar12) [64];
  undefined1 auVar13 [16];
  char cVar14;
  long lVar15;
  long lVar16;
  undefined1 (*pauVar17) [64];
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  char *pcVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [64];
  undefined1 (*pauVar29) [64];
  ulong uVar30;
  undefined8 uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  undefined1 (*pauVar35) [64];
  long lVar36;
  long lVar37;
  long lVar38;
  undefined1 (*pauVar39) [64];
  undefined1 (*pauVar40) [64];
  void *pvVar41;
  long lVar42;
  long lVar43;
  int64_t knl_x;
  long lVar44;
  long lVar45;
  long lVar46;
  undefined1 auVar47 [64];
  int64_t c;
  long local_130;
  long local_128;
  long local_108;
  undefined1 (*local_f8) [64];
  undefined1 (*local_b0) [64];
  
  pgVar1 = dst->src[1];
  pgVar2 = dst->src[0];
  uVar3 = pgVar1->ne[2];
  if (pgVar2->ne[3] == uVar3) {
    lVar36 = pgVar1->ne[3];
    if (dst->ne[3] == lVar36) {
      lVar4 = dst->ne[1];
      lVar5 = pgVar2->ne[0];
      lVar6 = pgVar2->ne[1];
      lVar7 = pgVar1->ne[1];
      lVar8 = dst->ne[0];
      lVar9 = pgVar1->ne[0];
      lVar42 = (long)dst->op_params[4];
      lVar24 = (long)dst->op_params[0];
      lVar19 = (long)dst->op_params[1];
      lVar15 = (long)dst->op_params[5];
      lVar25 = (long)dst->op_params[2];
      lVar20 = (long)dst->op_params[3];
      cVar14 = ggml_is_contiguous(pgVar1);
      if (cVar14 == '\0') {
        cVar14 = ggml_is_contiguous_channels(pgVar1);
        if (cVar14 == '\0') {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                     ,0x185b,"non-contiguous memory layout not supported");
        }
        if ((pgVar2->nb[0] < pgVar2->nb[2]) || (pgVar2->nb[1] < pgVar2->nb[0])) {
          pcVar23 = "kernel->nb[0] >= kernel->nb[2] && kernel->nb[1] >= kernel->nb[0]";
          uVar31 = 0x1858;
          goto LAB_00142321;
        }
        lVar36 = lVar36 * lVar4;
        lVar16 = (lVar36 + -1 + (long)params->nth) / (long)params->nth;
        lVar32 = params->ith * lVar16;
        lVar16 = lVar16 + lVar32;
        if (lVar36 <= lVar16) {
          lVar16 = lVar36;
        }
        uVar27 = uVar3 + 0xf;
        if (-1 < (long)uVar3) {
          uVar27 = uVar3;
        }
        if (lVar32 < lVar16) {
          pauVar12 = (undefined1 (*) [64])pgVar2->data;
          uVar22 = uVar27 & 0xfffffffffffffff0;
          lVar36 = lVar5 * uVar3 * 4;
          lVar37 = uVar3 * lVar42 * 4;
          lVar21 = uVar3 * lVar24 * 4;
          lVar33 = lVar9 * uVar3 * lVar15 * 4;
          do {
            if (0 < lVar8) {
              lVar43 = 0;
              lVar26 = (lVar32 % lVar4) * lVar19 - lVar20;
              local_f8 = (undefined1 (*) [64])
                         (((lVar19 * 4 * (lVar32 % lVar4) + lVar20 * -4 +
                           (lVar32 / lVar4) * lVar7 * 4) * lVar9 + lVar25 * -4) * uVar3 +
                         (long)pgVar1->data);
              local_b0 = local_f8 + ((long)uVar27 >> 4);
              local_108 = -lVar25;
              do {
                lVar44 = (lVar43 + lVar32 * lVar8) * uVar3;
                pvVar10 = dst->data;
                if (0xf < (long)uVar3) {
                  lVar18 = 0;
                  pauVar28 = local_f8;
                  pauVar39 = pauVar12;
                  do {
                    auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                    if (0 < lVar6) {
                      lVar38 = 0;
                      pauVar29 = pauVar28;
                      pauVar40 = pauVar39;
                      do {
                        lVar34 = lVar38 * lVar15 + lVar26;
                        pauVar17 = pauVar29;
                        pauVar35 = pauVar40;
                        lVar46 = local_108;
                        lVar45 = lVar5;
                        if ((-1 < lVar34 && 0 < lVar5) && lVar34 < lVar7) {
                          do {
                            if (lVar46 < lVar9 && -1 < lVar46) {
                              auVar47 = vfmadd231ps_avx512f(auVar47,*pauVar35,*pauVar17);
                            }
                            lVar45 = lVar45 + -1;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + lVar37);
                            pauVar35 = (undefined1 (*) [64])(*pauVar35 + uVar3 * 4);
                            lVar46 = lVar46 + lVar42;
                          } while (lVar45 != 0);
                        }
                        pauVar40 = (undefined1 (*) [64])(*pauVar40 + lVar36);
                        pauVar29 = (undefined1 (*) [64])(*pauVar29 + lVar33);
                        lVar38 = lVar38 + 1;
                      } while (lVar38 != lVar6);
                    }
                    *(undefined1 (*) [64])((long)pvVar10 + lVar18 * 4 + lVar44 * 4) = auVar47;
                    lVar18 = lVar18 + 0x10;
                    pauVar39 = pauVar39 + 1;
                    pauVar28 = pauVar28 + 1;
                  } while (lVar18 < (long)uVar22);
                }
                uVar30 = uVar22;
                pauVar28 = pauVar12 + ((long)uVar27 >> 4);
                pauVar39 = local_b0;
                if ((long)uVar22 < (long)uVar3) {
                  do {
                    auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                    if (0 < lVar6) {
                      lVar18 = 0;
                      pauVar29 = pauVar28;
                      pauVar40 = pauVar39;
                      do {
                        lVar45 = lVar18 * lVar15 + lVar26;
                        pauVar17 = pauVar40;
                        lVar38 = local_108;
                        pauVar35 = pauVar29;
                        lVar46 = lVar5;
                        if ((-1 < lVar45 && 0 < lVar5) && lVar45 < lVar7) {
                          do {
                            if (lVar38 < lVar9 && -1 < lVar38) {
                              auVar13 = vfmadd231ss_fma(auVar47._0_16_,ZEXT416(*(uint *)*pauVar35),
                                                        ZEXT416(*(uint *)*pauVar17));
                              auVar47 = ZEXT1664(auVar13);
                            }
                            lVar46 = lVar46 + -1;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + lVar37);
                            lVar38 = lVar38 + lVar42;
                            pauVar35 = (undefined1 (*) [64])(*pauVar35 + uVar3 * 4);
                          } while (lVar46 != 0);
                        }
                        pauVar29 = (undefined1 (*) [64])(*pauVar29 + lVar36);
                        pauVar40 = (undefined1 (*) [64])(*pauVar40 + lVar33);
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != lVar6);
                    }
                    *(int *)((long)pvVar10 + uVar30 * 4 + lVar44 * 4) = auVar47._0_4_;
                    uVar30 = uVar30 + 1;
                    pauVar28 = (undefined1 (*) [64])(*pauVar28 + 4);
                    pauVar39 = (undefined1 (*) [64])(*pauVar39 + 4);
                  } while (uVar30 != uVar3);
                }
                local_108 = local_108 + lVar24;
                local_f8 = (undefined1 (*) [64])(*local_f8 + lVar21);
                local_b0 = (undefined1 (*) [64])(*local_b0 + lVar21);
                lVar43 = lVar43 + 1;
              } while (lVar43 != lVar8);
            }
            lVar32 = lVar32 + 1;
          } while (lVar32 != lVar16);
        }
      }
      else {
        lVar36 = lVar36 * uVar3;
        lVar16 = (lVar36 + -1 + (long)params->nth) / (long)params->nth;
        lVar32 = lVar16 * params->ith;
        if (lVar16 + lVar32 < lVar36) {
          lVar36 = lVar16 + lVar32;
        }
        if (lVar32 < lVar36) {
          pvVar10 = dst->data;
          pvVar11 = pgVar2->data;
          local_f8 = (undefined1 (*) [64])
                     ((lVar16 * lVar7 * (long)params->ith * 4 + lVar20 * -4) * lVar9 + lVar25 * -4 +
                     (long)pgVar1->data);
          do {
            if (0 < lVar4) {
              local_130 = 0;
              local_128 = (long)local_f8;
              do {
                if (0 < lVar8) {
                  lVar33 = 0;
                  lVar16 = local_128;
                  lVar37 = -lVar25;
                  do {
                    auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                    if (0 < lVar6) {
                      lVar26 = 0;
                      lVar21 = lVar16;
                      pvVar41 = (void *)((long)pvVar11 + (lVar32 % (long)uVar3) * lVar6 * lVar5 * 4)
                      ;
                      do {
                        lVar43 = lVar26 * lVar15 + (local_130 * lVar19 - lVar20);
                        if ((-1 < lVar43 && 0 < lVar5) && lVar43 < lVar7) {
                          lVar43 = 0;
                          lVar44 = 0;
                          do {
                            if (lVar37 + lVar43 < lVar9 && -1 < lVar37 + lVar43) {
                              auVar13 = vfmadd231ss_fma(auVar47._0_16_,
                                                        ZEXT416(*(uint *)((long)pvVar41 + lVar44 * 4
                                                                         )),
                                                        ZEXT416(*(uint *)(lVar21 + lVar43 * 4)));
                              auVar47 = ZEXT1664(auVar13);
                            }
                            lVar44 = lVar44 + 1;
                            lVar43 = lVar43 + lVar42;
                          } while (lVar5 != lVar44);
                        }
                        lVar26 = lVar26 + 1;
                        pvVar41 = (void *)((long)pvVar41 + lVar5 * 4);
                        lVar21 = lVar21 + lVar9 * lVar15 * 4;
                      } while (lVar26 != lVar6);
                    }
                    lVar37 = lVar37 + lVar24;
                    lVar16 = lVar16 + lVar24 * 4;
                    *(int *)((long)pvVar10 +
                            lVar33 * 4 + local_130 * lVar8 * 4 + lVar4 * lVar8 * lVar32 * 4) =
                         auVar47._0_4_;
                    lVar33 = lVar33 + 1;
                  } while (lVar33 != lVar8);
                }
                local_128 = local_128 + lVar9 * lVar19 * 4;
                local_130 = local_130 + 1;
              } while (local_130 != lVar4);
            }
            local_f8 = (undefined1 (*) [64])((long)local_f8 + lVar7 * lVar9 * 4);
            lVar32 = lVar32 + 1;
          } while (lVar32 != lVar36);
        }
      }
      return;
    }
    pcVar23 = "dst->ne[3] == p.batch";
    uVar31 = 0x1852;
  }
  else {
    pcVar23 = "kernel->ne[3] == p.channels";
    uVar31 = 0x1851;
  }
LAB_00142321:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar31,"GGML_ASSERT(%s) failed",pcVar23);
}

Assistant:

void ggml_compute_forward_conv_2d_dw(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * kernel = dst->src[0];
    const ggml_tensor * src = dst->src[1];
    ggml_conv_2d_dw_params p;
    p.channels = src->ne[2];
    p.batch = src->ne[3];
    p.src_w = src->ne[0];
    p.src_h = src->ne[1];
    p.dst_w = dst->ne[0];
    p.dst_h = dst->ne[1];
    p.knl_w = kernel->ne[0];
    p.knl_h = kernel->ne[1];
    p.stride_x = dst->op_params[0];
    p.stride_y = dst->op_params[1];
    p.pad_x = dst->op_params[2];
    p.pad_y = dst->op_params[3];
    p.dilation_x = dst->op_params[4];
    p.dilation_y = dst->op_params[5];

    GGML_ASSERT(kernel->ne[3] == p.channels);
    GGML_ASSERT(dst->ne[3] == p.batch);

    if (ggml_is_contiguous(src)) {
        ggml_compute_forward_conv_2d_dw_whcn(params, src, kernel, dst, p);
    } else if (ggml_is_contiguous_channels(src)) {
        // kernel should also have channels most contiguous in memory
        GGML_ASSERT(kernel->nb[0] >= kernel->nb[2] && kernel->nb[1] >= kernel->nb[0]);
        ggml_compute_forward_conv_2d_dw_cwhn(params, src, kernel, dst, p);
    } else {
        GGML_ABORT("non-contiguous memory layout not supported");
    }
}